

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# czsurface.c
# Opt level: O2

czsurface_blit_status czsurface_blit(czsurface *src,czsurface *dst,czpoint dstpoint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uchar *__src;
  uchar *__dest;
  
  __src = src->pixels;
  iVar1 = dst->width;
  iVar2 = dst->bpp;
  __dest = dst->pixels + (dstpoint.y * iVar1 + dstpoint.x) * iVar2;
  iVar3 = src->width;
  iVar4 = src->bpp;
  for (uVar5 = 0; uVar5 < (uint)src->height; uVar5 = uVar5 + 1) {
    memcpy(__dest,__src,(ulong)(uint)(src->width * dst->bpp));
    __dest = __dest + iVar2 * iVar1;
    __src = __src + (long)iVar4 * (long)iVar3;
  }
  return CZSURFACE_BLIT_OK;
}

Assistant:

czsurface_blit_status czsurface_blit(czsurface * src, czsurface * dst, czpoint dstpoint) {
    czsurface_internal_blit(src, dst, dstpoint);
    return CZSURFACE_BLIT_OK;
}